

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
mxx::global_scan<int,mxx::min<int>>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,mxx *this,undefined8 in)

{
  size_type __n;
  const_iterator cVar1;
  const_iterator cVar2;
  iterator iVar3;
  allocator<int> local_2a;
  undefined1 local_29;
  undefined8 local_28;
  comm *comm_local;
  vector<int,_std::allocator<int>_> *in_local;
  vector<int,_std::allocator<int>_> *local_10;
  vector<int,_std::allocator<int>_> *result;
  
  local_29 = 0;
  local_28 = in;
  comm_local = (comm *)this;
  local_10 = __return_storage_ptr__;
  __n = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)this);
  std::allocator<int>::allocator(&local_2a);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,__n,&local_2a);
  std::allocator<int>::~allocator(&local_2a);
  cVar1 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)comm_local);
  cVar2 = std::vector<int,_std::allocator<int>_>::end
                    ((vector<int,_std::allocator<int>_> *)comm_local);
  iVar3 = std::vector<int,_std::allocator<int>_>::begin(__return_storage_ptr__);
  global_scan<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,mxx::min<int>>
            (cVar1._M_current,cVar2._M_current,iVar3._M_current,1,local_28);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> global_scan(const std::vector<T>& in, Func func, const mxx::comm& comm = mxx::comm()) {
    std::vector<T> result(in.size());
    global_scan(in.begin(), in.end(), result.begin(), func, true, comm);
    return result;
}